

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  pointer *pppMVar1;
  iterator iVar2;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __last;
  _Iter_comp_iter<google::protobuf::MapEntryMessageComparator> __comp;
  bool bVar3;
  int iVar4;
  MapFieldBase *this;
  RepeatedPtrFieldBase *this_00;
  MessageFactory *pMVar5;
  undefined4 extraout_var;
  Descriptor *pDVar6;
  long lVar7;
  Message **__buffer;
  int iVar8;
  pair<const_google::protobuf::Message_**,_long> pVar9;
  MapIterator iter;
  Message *map_entry_message;
  MapIterator local_c0;
  MapIterator local_78;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar3 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar3) {
    iVar8 = 0;
    this_00 = (RepeatedPtrFieldBase *)
              Reflection::GetRawRepeatedField
                        (reflection,message,field,CPPTYPE_MESSAGE,-1,(Descriptor *)0x0);
    if (0 < this_00->current_size_) {
      do {
        local_c0.iter_ =
             RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                       (this_00,iVar8);
        iVar2._M_current =
             (sorted_map_field->
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (sorted_map_field->
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
          ::_M_realloc_insert<google::protobuf::Message_const*>
                    ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                      *)sorted_map_field,iVar2,(Message **)&local_c0);
        }
        else {
          *iVar2._M_current = (Message *)local_c0.iter_;
          pppMVar1 = &(sorted_map_field->
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < this_00->current_size_);
    }
  }
  else {
    pDVar6 = FieldDescriptor::message_type(field);
    pMVar5 = Reflection::GetMessageFactory(reflection);
    iVar8 = (*pMVar5->_vptr_MessageFactory[2])(pMVar5,pDVar6);
    Reflection::MapBegin(&local_c0,reflection,message,field);
    while( true ) {
      Reflection::MapEnd(&local_78,reflection,message,field);
      iVar4 = (*(local_c0.map_)->_vptr_MapFieldBase[6])(local_c0.map_,&local_c0,&local_78);
      MapIterator::~MapIterator(&local_78);
      if ((char)iVar4 != '\0') break;
      local_78.iter_ =
           (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x18))
                             ((long *)CONCAT44(extraout_var,iVar8),0);
      CopyKey(&local_c0.key_,(Message *)local_78.iter_,*(FieldDescriptor **)(pDVar6 + 0x28));
      CopyValue(&local_c0.value_,(Message *)local_78.iter_,
                (FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + 0x48));
      iVar2._M_current =
           (sorted_map_field->
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (sorted_map_field->
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
        _M_realloc_insert<google::protobuf::Message_const*const&>
                  ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    *)sorted_map_field,iVar2,(Message **)&local_78);
      }
      else {
        *iVar2._M_current = (Message *)local_78.iter_;
        pppMVar1 = &(sorted_map_field->
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
    }
    MapIterator::~MapIterator(&local_c0);
  }
  pDVar6 = FieldDescriptor::message_type(field);
  __first._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.field_ = *(MapEntryMessageComparator *)(pDVar6 + 0x28);
    lVar7 = (long)__last._M_current - (long)__first._M_current >> 3;
    pVar9 = std::get_temporary_buffer<google::protobuf::Message_const*>
                      ((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
    __buffer = pVar9.first;
    if (__buffer == (Message **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__comp);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::Message_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__buffer,pVar9.second,__comp);
    }
    operator_delete(__buffer);
  }
  return !bVar3;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO(teboring): For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}